

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimCreator.cpp
# Opt level: O1

Globals * __thiscall
OpenMD::SimCreator::parseFile
          (SimCreator *this,istream *rawMetaDataStream,string *filename,int mdFileVersion,
          int startOfMetaDataBlock)

{
  Globals *pGVar1;
  SimplePreprocessor preprocessor;
  MDParser parser;
  FilenameObserver observer;
  MDLexer lexer;
  ASTFactory factory;
  stringstream ppStream;
  MDTreeParser treeParser;
  SimplePreprocessor local_34d;
  int local_34c;
  RefAST local_348;
  MDParser local_340;
  FilenameObserver local_318;
  MDLexer local_308;
  ASTFactory local_270;
  undefined1 local_240 [128];
  ios_base aiStack_1c0 [264];
  MDTreeParser local_b8;
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_240);
  SimplePreprocessor::preprocess
            (&local_34d,rawMetaDataStream,filename,startOfMetaDataBlock,
             (ostream *)(local_240 + 0x10));
  MDLexer::MDLexer(&local_308,(istream *)local_240);
  std::__cxx11::string::_M_assign
            ((string *)&(local_308.super_CharScanner.inputState.ref)->ptr->filename);
  local_308.super_CharScanner._140_4_ = 0;
  MDParser::MDParser(&local_340,(TokenStream *)&local_308);
  std::__cxx11::string::_M_assign
            ((string *)&(local_340.super_LLkParser.super_Parser.inputState.ref)->ptr->filename);
  FilenameObserver::FilenameObserver(&local_318);
  FilenameObserver::setLexer(&local_318,&local_308);
  FilenameObserver::setParser(&local_318,&local_340);
  local_308.observer = &local_318;
  antlr::ASTFactory::ASTFactory(&local_270);
  MDParser::initializeASTFactory(&local_340,&local_270);
  local_340.super_LLkParser.super_Parser.astFactory = &local_270;
  MDParser::mdfile(&local_340);
  MDTreeParser::MDTreeParser(&local_b8);
  MDTreeParser::initializeASTFactory(&local_270);
  if (local_340.returnAST.ref == (ASTRef *)0x0) {
    local_340.returnAST.ref = (ASTRef *)0x0;
  }
  else {
    (local_340.returnAST.ref)->count = (local_340.returnAST.ref)->count + 1;
  }
  local_34c = mdFileVersion;
  local_348.ref = local_340.returnAST.ref;
  local_b8.super_TreeParser.astFactory = &local_270;
  pGVar1 = MDTreeParser::walkTree(&local_b8,&local_348);
  antlr::ASTRefCount<antlr::AST>::~ASTRefCount(&local_348);
  local_b8.super_TreeParser._vptr_TreeParser = (_func_int **)&PTR__MDTreeParser_0033cf40;
  antlr::ASTRefCount<antlr::AST>::~ASTRefCount(&local_b8._retTree);
  antlr::ASTRefCount<antlr::AST>::~ASTRefCount(&local_b8.returnAST);
  std::_Deque_base<OpenMD::DataHolder_*,_std::allocator<OpenMD::DataHolder_*>_>::~_Deque_base
            ((_Deque_base<OpenMD::DataHolder_*,_std::allocator<OpenMD::DataHolder_*>_> *)
             &local_b8.blockStack);
  local_b8.super_TreeParser._vptr_TreeParser = (_func_int **)&PTR__TreeParser_0033e738;
  antlr::RefCount<antlr::TreeParserInputState>::~RefCount(&local_b8.super_TreeParser.inputState);
  antlr::ASTFactory::~ASTFactory(&local_270);
  local_340.super_LLkParser.super_Parser._vptr_Parser = (_func_int **)&PTR__MDParser_0033d050;
  antlr::ASTRefCount<antlr::AST>::~ASTRefCount(&local_340.returnAST);
  local_340.super_LLkParser.super_Parser._vptr_Parser = (_func_int **)&PTR__Parser_0033e538;
  antlr::RefCount<antlr::ParserInputState>::~RefCount
            (&local_340.super_LLkParser.super_Parser.inputState);
  antlr::CharScanner::~CharScanner(&local_308.super_CharScanner);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_240);
  std::ios_base::~ios_base(aiStack_1c0);
  (pGVar1->MDfileVersion).super_ParameterBase.empty_ = false;
  *(int *)&(pGVar1->MDfileVersion).super_ParameterBase.field_0x2c = local_34c;
  return pGVar1;
}

Assistant:

Globals* SimCreator::parseFile(std::istream& rawMetaDataStream,
                                 const std::string& filename, int mdFileVersion,
                                 int startOfMetaDataBlock) {
    Globals* simParams = NULL;
    try {
      // Create a preprocessor that preprocesses md file into an ostringstream
      std::stringstream ppStream;
#ifdef IS_MPI
      int streamSize;
      const int primaryNode = 0;

      if (worldRank == primaryNode) {
        MPI_Bcast(&mdFileVersion, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);
#endif
        SimplePreprocessor preprocessor;
        preprocessor.preprocess(rawMetaDataStream, filename,
                                startOfMetaDataBlock, ppStream);

#ifdef IS_MPI
        // broadcasting the stream size
        streamSize = ppStream.str().size() + 1;
        MPI_Bcast(&streamSize, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);
        MPI_Bcast(static_cast<void*>(const_cast<char*>(ppStream.str().c_str())),
                  streamSize, MPI_CHAR, primaryNode, MPI_COMM_WORLD);
      } else {
        MPI_Bcast(&mdFileVersion, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);

        // get stream size
        MPI_Bcast(&streamSize, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);
        char* buf = new char[streamSize];
        assert(buf);

        // receive file content
        MPI_Bcast(buf, streamSize, MPI_CHAR, primaryNode, MPI_COMM_WORLD);

        ppStream.str(buf);
        delete[] buf;
      }
#endif
      // Create a scanner that reads from the input stream
      MDLexer lexer(ppStream);
      lexer.setFilename(filename);
      lexer.initDeferredLineCount();

      // Create a parser that reads from the scanner
      MDParser parser(lexer);
      parser.setFilename(filename);

      // Create an observer that synchorizes file name change
      FilenameObserver observer;
      observer.setLexer(&lexer);
      observer.setParser(&parser);
      lexer.setObserver(&observer);
      antlr::ASTFactory factory;
      parser.initializeASTFactory(factory);
      parser.setASTFactory(&factory);
      parser.mdfile();
      // Create a tree parser that reads information into Globals
      MDTreeParser treeParser;
      treeParser.initializeASTFactory(factory);
      treeParser.setASTFactory(&factory);
      simParams = treeParser.walkTree(parser.getAST());
    }

    catch (antlr::MismatchedCharException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Mismatched Character: %s in file %s at line %d, column %d\n",
               e.getMessage().c_str(), e.getFilename().c_str(), e.getLine(),
               e.getColumn());
      painCave.isFatal = 1;
      simError();
    } catch (antlr::MismatchedTokenException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Mismatched Token: %s in file %s at line %d, column %d\n",
               e.getMessage().c_str(), e.getFilename().c_str(), e.getLine(),
               e.getColumn());
      painCave.isFatal = 1;
      simError();
    } catch (antlr::NoViableAltForCharException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "No Viable Alternative for Character: %s in file %s at line %d, "
               "column %d\n",
               e.getMessage().c_str(), e.getFilename().c_str(), e.getLine(),
               e.getColumn());
      painCave.isFatal = 1;
      simError();
    } catch (antlr::NoViableAltException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "No Viable Alternative: %s in file %s at line %d, column %d\n",
               e.getMessage().c_str(), e.getFilename().c_str(), e.getLine(),
               e.getColumn());
      painCave.isFatal = 1;
      simError();
    }

    catch (antlr::TokenStreamRecognitionException& e) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "Token Stream Recognition: %s in file %s at line %d, column %d\n",
          e.getMessage().c_str(), e.getFilename().c_str(), e.getLine(),
          e.getColumn());
      painCave.isFatal = 1;
      simError();
    }

    catch (antlr::TokenStreamIOException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Token Stream IO exception: %s\n", e.getMessage().c_str());
      painCave.isFatal = 1;
      simError();
    }

    catch (antlr::TokenStreamException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Token Stream exception: %s\n", e.getMessage().c_str());
      painCave.isFatal = 1;
      simError();
    } catch (antlr::RecognitionException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Recognition exception: %s in file %s at line %d, column %d\n",
               e.getMessage().c_str(), e.getFilename().c_str(), e.getLine(),
               e.getColumn());
      painCave.isFatal = 1;
      simError();
    } catch (antlr::CharStreamException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Character Stream exception: %s\n", e.getMessage().c_str());
      painCave.isFatal = 1;
      simError();
    } catch (OpenMDException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH, "%s\n", e.what());
      painCave.isFatal = 1;
      simError();
    } catch (std::exception& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "parser exception: %s\n", e.what());
      painCave.isFatal = 1;
      simError();
    }

    simParams->setMDfileVersion(mdFileVersion);
    return simParams;
  }